

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gls::InteractionTestUtil::getRandomColor(InteractionTestUtil *this,Random *rnd)

{
  float x_;
  float y_;
  float z_;
  float w_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Vec4 VVar2;
  float a;
  float b;
  float g;
  float r;
  Random *rnd_local;
  
  x_ = de::Random::choose<float,float_const*>(rnd,getRandomColor::components,(float *)&DAT_00afe25c)
  ;
  y_ = de::Random::choose<float,float_const*>(rnd,getRandomColor::components,(float *)&DAT_00afe25c)
  ;
  z_ = de::Random::choose<float,float_const*>(rnd,getRandomColor::components,(float *)&DAT_00afe25c)
  ;
  w_ = de::Random::choose<float,float_const*>(rnd,getRandomColor::components,(float *)&DAT_00afe25c)
  ;
  uVar1 = (ulong)(uint)y_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,w_);
  VVar2.m_data[2] = (float)(int)uVar1;
  VVar2.m_data[3] = (float)(int)(uVar1 >> 0x20);
  VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

static Vec4 getRandomColor (de::Random& rnd)
{
	static const float components[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.6f, 0.8f, 1.0f };
	float r = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float g = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float b = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float a = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	return Vec4(r, g, b, a);
}